

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O1

int __thiscall UdpLayer::closeSocket(UdpLayer *this)

{
  pthread_mutex_lock((pthread_mutex_t *)&this->sockMtx);
  if (0 < this->sockfd) {
    bdnet_close(this->sockfd);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sockMtx);
  return 1;
}

Assistant:

int UdpLayer::closeSocket() {
	/* close socket if open */
	sockMtx.lock();   /********** LOCK MUTEX *********/

	if (sockfd > 0)
        bdnet_close(sockfd);

	sockMtx.unlock(); /******** UNLOCK MUTEX *********/
	return 1;
}